

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O2

void TextElementEnd(textwriter_conflict *Text)

{
  if (Text->HasChild != 0) {
    if (Text->InsideContent != 0) {
      TextPrintf(Text,"</%s> ",Text->Element);
      return;
    }
    TextPrintf(Text,"%*c/%s>\n",(ulong)(uint)Text->Deep,0x3c,Text->Element);
    return;
  }
  if (Text->SafeFormat == 0) {
    TextWrite(Text,"/>");
  }
  else {
    TextPrintf(Text,"></%s>",Text->Element);
  }
  if (Text->InsideContent != 0) {
    return;
  }
  TextWrite(Text,"\n");
  return;
}

Assistant:

void TextElementEnd(textwriter* Text)
{
    if (Text->HasChild)
    {
        if (Text->InsideContent)
            TextPrintf(Text,T("</%s> "),Text->Element);
        else
            TextPrintf(Text,T("%*c/%s>\n"),Text->Deep,'<',Text->Element);
    }
    else
    {
        if (Text->SafeFormat)
            TextPrintf(Text,T("></%s>"),Text->Element);
        else
            TextWrite(Text,T("/>"));
        if (!Text->InsideContent)
            TextWrite(Text,T("\n"));
    }
}